

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator&=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 *p;
  uint32 *puVar1;
  uint uVar2;
  uint local_40;
  uint32 c;
  uint j;
  uint32 oc;
  uint32 *s;
  uint32 *d;
  uint i;
  sparse_bit_array *other_local;
  sparse_bit_array *this_local;
  
  if (this != other) {
    if (other->m_num_groups != this->m_num_groups) {
      crnlib_assert("other.m_num_groups == m_num_groups",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                    ,0x172);
    }
    for (d._4_4_ = 0; d._4_4_ < this->m_num_groups; d._4_4_ = d._4_4_ + 1) {
      p = this->m_ppGroups[d._4_4_];
      if (p != (uint32 *)0x0) {
        puVar1 = other->m_ppGroups[d._4_4_];
        if (puVar1 == (uint32 *)0x0) {
          free_group(p);
          this->m_ppGroups[d._4_4_] = (uint32 *)0x0;
        }
        else {
          c = 0;
          for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
            uVar2 = p[local_40] & puVar1[local_40];
            p[local_40] = uVar2;
            c = uVar2 | c;
          }
          if (c == 0) {
            free_group(p);
            this->m_ppGroups[d._4_4_] = (uint32 *)0x0;
          }
        }
      }
    }
  }
  return this;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator&=(const sparse_bit_array& other)
    {
        if (this == &other)
        {
            return *this;
        }

        CRNLIB_VERIFY(other.m_num_groups == m_num_groups);

        for (uint i = 0; i < m_num_groups; i++)
        {
            uint32* d = m_ppGroups[i];
            if (!d)
            {
                continue;
            }
            uint32* s = other.m_ppGroups[i];

            if (!s)
            {
                free_group(d);
                m_ppGroups[i] = nullptr;
            }
            else
            {
                uint32 oc = 0;
                for (uint j = 0; j < cDWORDsPerGroup; j++)
                {
                    uint32 c = d[j] & s[j];
                    d[j] = c;
                    oc |= c;
                }
                if (!oc)
                {
                    free_group(d);
                    m_ppGroups[i] = nullptr;
                }
            }
        }

        return *this;
    }